

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void adios2sys::SystemTools::ReplaceString(string *source,char *replace,char *with)

{
  size_t replaceSize;
  char *pcVar1;
  allocator local_41;
  string local_40;
  
  if (*replace != '\0') {
    replaceSize = strlen(replace);
    pcVar1 = "";
    if (with != (char *)0x0) {
      pcVar1 = with;
    }
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    SystemToolsStatic::ReplaceString(source,replace,replaceSize,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void SystemTools::ReplaceString(std::string& source, const char* replace,
                                const char* with)
{
  // do while hangs if replaceSize is 0
  if (!*replace) {
    return;
  }

  SystemToolsStatic::ReplaceString(source, replace, strlen(replace),
                                   with ? with : "");
}